

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryLayeredRenderingTests.cpp
# Opt level: O2

bool vkt::geometry::anon_unknown_0::verifyImageSingleColoredRow
               (TestLog *log,ConstPixelBufferAccess *image,float rowWidthRatio,Vec4 *barColor)

{
  ostringstream *poVar1;
  bool bVar2;
  bool bVar3;
  TestLog *pTVar4;
  ulong __n;
  ConstPixelBufferAccess *pCVar5;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  int x;
  int y;
  uint uVar6;
  int iVar7;
  LogImageSet *this;
  bool bVar8;
  allocator<char> local_4be;
  allocator<char> local_4bd;
  allocator<char> local_4bc;
  allocator<char> local_4bb;
  allocator<char> local_4ba;
  allocator<char> local_4b9;
  ConstPixelBufferAccess *local_4b8;
  int local_4ac;
  TestLog *local_4a8;
  Vec4 *local_4a0;
  ulong local_498;
  string local_490;
  undefined1 local_470 [32];
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  ConstPixelBufferAccess local_3d0;
  Vec4 local_3a8;
  Vec4 local_398;
  Vec4 local_388;
  LogImageSet local_370;
  TextureLevel errorMask;
  Vec4 threshold;
  undefined1 local_2f8 [144];
  LogImage local_268;
  PixelBufferAccess errorMaskAccess;
  Vec4 color;
  
  local_4b8 = (ConstPixelBufferAccess *)CONCAT44(local_4b8._4_4_,rowWidthRatio);
  local_388.m_data[0] = 0.0;
  local_388.m_data[1] = 0.0;
  local_388.m_data[2] = 0.0;
  local_388.m_data[3] = 1.0;
  local_398.m_data[0] = 0.0;
  local_398.m_data[1] = 1.0;
  local_398.m_data[2] = 0.0;
  local_398.m_data[3] = 1.0;
  local_3a8.m_data[0] = 1.0;
  local_3a8.m_data[1] = 0.0;
  local_3a8.m_data[2] = 0.0;
  local_3a8.m_data[3] = 1.0;
  local_4a0 = barColor;
  tcu::Vector<float,_4>::Vector(&threshold,0.02);
  iVar7 = (image->m_size).m_data[0];
  uVar6 = (image->m_size).m_data[1];
  __n = (ulong)uVar6;
  tcu::TextureLevel::TextureLevel(&errorMask,&image->m_format,iVar7,uVar6,1);
  tcu::TextureLevel::getAccess(&errorMaskAccess,&errorMask);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&color,&errorMask);
  tcu::clear((PixelBufferAccess *)&color,&local_398);
  poVar1 = (ostringstream *)(color.m_data + 2);
  color.m_data._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Expecting all pixels with distance less or equal to (about) ");
  iVar7 = (int)((float)iVar7 * local_4b8._0_4_);
  std::ostream::operator<<(poVar1,iVar7);
  std::operator<<((ostream *)poVar1," pixels from left border to be of color ");
  local_2f8._8_4_ = local_4a0->m_data[2];
  local_2f8._0_8_ = *(undefined8 *)local_4a0->m_data;
  local_4b8 = image;
  local_4a8 = log;
  tcu::operator<<((ostream *)poVar1,(Vector<float,_3> *)local_2f8);
  std::operator<<((ostream *)poVar1,".");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&color,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  local_4ac = iVar7 + -1;
  local_498 = (ulong)(iVar7 + 1);
  bVar8 = true;
  for (uVar6 = 0; (int)uVar6 < (local_4b8->m_size).m_data[1]; uVar6 = uVar6 + 1) {
    for (iVar7 = 0; iVar7 < (local_4b8->m_size).m_data[0]; iVar7 = iVar7 + 1) {
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)&color,(int)local_4b8,iVar7,uVar6);
      bVar2 = compareColors(&color,&local_388,&threshold);
      bVar3 = compareColors(&color,local_4a0,&threshold);
      bVar2 = bVar2 || iVar7 < (int)local_498 && bVar3;
      __n = (ulong)bVar2;
      if (local_4ac < iVar7) {
        bVar3 = bVar2;
      }
      if (bVar3 == false) {
        __n = (ulong)uVar6;
        tcu::PixelBufferAccess::setPixel(&errorMaskAccess,&local_3a8,iVar7,uVar6,0);
      }
      bVar8 = (bool)(bVar3 & bVar8);
    }
  }
  poVar1 = (ostringstream *)(color.m_data + 2);
  if (bVar8 == false) {
    color.m_data._0_8_ = local_4a8;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Image verification failed. Got unexpected pixels.");
    pTVar4 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)&color,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_470,"LayerContent",&local_4b9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_490,"Layer content",&local_4ba);
    tcu::LogImageSet::LogImageSet(&local_370,(string *)local_470,&local_490);
    iVar7 = (int)pTVar4;
    tcu::LogImageSet::write(&local_370,iVar7,__buf_01,__n);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"Layer",&local_4bb);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_410,"Layer",&local_4bc);
    pCVar5 = local_4b8;
    tcu::LogImage::LogImage
              ((LogImage *)local_2f8,&local_3f0,&local_410,local_4b8,QP_IMAGE_COMPRESSION_MODE_BEST)
    ;
    tcu::LogImage::write((LogImage *)local_2f8,iVar7,__buf_02,(size_t)pCVar5);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_430,"ErrorMask",&local_4bd);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_470 + 0x20),"Errors",&local_4be);
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_3d0,&errorMask);
    pCVar5 = &local_3d0;
    tcu::LogImage::LogImage
              (&local_268,&local_430,(string *)(local_470 + 0x20),pCVar5,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_268,iVar7,__buf_03,(size_t)pCVar5);
    tcu::TestLog::endImageSet(pTVar4);
    tcu::LogImage::~LogImage(&local_268);
    std::__cxx11::string::~string((string *)(local_470 + 0x20));
    std::__cxx11::string::~string((string *)&local_430);
    tcu::LogImage::~LogImage((LogImage *)local_2f8);
    std::__cxx11::string::~string((string *)&local_410);
    std::__cxx11::string::~string((string *)&local_3f0);
    tcu::LogImageSet::~LogImageSet(&local_370);
    std::__cxx11::string::~string((string *)&local_490);
    this = (LogImageSet *)local_470;
  }
  else {
    color.m_data._0_8_ = local_4a8;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Image is valid.");
    pTVar4 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)&color,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_370,"LayerContent",(allocator<char> *)&local_3f0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3d0,"Layer content",(allocator<char> *)&local_410);
    tcu::LogImageSet::LogImageSet((LogImageSet *)&local_268,&local_370.m_name,(string *)&local_3d0);
    tcu::LogImageSet::write((LogImageSet *)&local_268,(int)pTVar4,__buf,__n);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_470,"Layer",(allocator<char> *)&local_430);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_490,"Layer",(allocator<char> *)(local_470 + 0x20));
    pCVar5 = local_4b8;
    tcu::LogImage::LogImage
              ((LogImage *)local_2f8,(string *)local_470,&local_490,local_4b8,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_2f8,(int)pTVar4,__buf_00,(size_t)pCVar5);
    tcu::TestLog::endImageSet(pTVar4);
    tcu::LogImage::~LogImage((LogImage *)local_2f8);
    std::__cxx11::string::~string((string *)&local_490);
    std::__cxx11::string::~string((string *)local_470);
    tcu::LogImageSet::~LogImageSet((LogImageSet *)&local_268);
    std::__cxx11::string::~string((string *)&local_3d0);
    this = &local_370;
  }
  std::__cxx11::string::~string((string *)this);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  tcu::TextureLevel::~TextureLevel(&errorMask);
  return bVar8;
}

Assistant:

bool verifyImageSingleColoredRow (tcu::TestLog& log, const tcu::ConstPixelBufferAccess image, const float rowWidthRatio, const tcu::Vec4& barColor)
{
	DE_ASSERT(rowWidthRatio > 0.0f);

	const Vec4				black				(0.0f, 0.0f, 0.0f, 1.0f);
	const Vec4				green				(0.0f, 1.0f, 0.0f, 1.0f);
	const Vec4				red					(1.0f, 0.0f, 0.0f, 1.0f);
	const Vec4				threshold			(0.02f);
	const int				barLength			= static_cast<int>(rowWidthRatio * static_cast<float>(image.getWidth()));
	const int				barLengthThreshold	= 1;
	tcu::TextureLevel		errorMask			(image.getFormat(), image.getWidth(), image.getHeight());
	tcu::PixelBufferAccess	errorMaskAccess		= errorMask.getAccess();

	tcu::clear(errorMask.getAccess(), green);

	log << tcu::TestLog::Message
		<< "Expecting all pixels with distance less or equal to (about) " << barLength
		<< " pixels from left border to be of color " << barColor.swizzle(0, 1, 2) << "."
		<< tcu::TestLog::EndMessage;

	bool allPixelsOk = true;

	for (int y = 0; y < image.getHeight(); ++y)
	for (int x = 0; x < image.getWidth();  ++x)
	{
		const Vec4	color		= image.getPixel(x, y);
		const bool	isBlack		= compareColors(color, black, threshold);
		const bool	isColor		= compareColors(color, barColor, threshold);

		bool isOk;

		if (x <= barLength - barLengthThreshold)
			isOk = isColor;
		else if (x >= barLength + barLengthThreshold)
			isOk = isBlack;
		else
			isOk = isColor || isBlack;

		allPixelsOk &= isOk;

		if (!isOk)
			errorMaskAccess.setPixel(red, x, y);
	}

	if (allPixelsOk)
	{
		log << tcu::TestLog::Message << "Image is valid." << tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("LayerContent", "Layer content")
			<< tcu::TestLog::Image("Layer", "Layer", image)
			<< tcu::TestLog::EndImageSet;
		return true;
	}
	else
	{
		log << tcu::TestLog::Message << "Image verification failed. Got unexpected pixels." << tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("LayerContent", "Layer content")
			<< tcu::TestLog::Image("Layer",		"Layer",	image)
			<< tcu::TestLog::Image("ErrorMask",	"Errors",	errorMask)
			<< tcu::TestLog::EndImageSet;
		return false;
	}

	log << tcu::TestLog::Image("LayerContent", "Layer content", image);

	return allPixelsOk;
}